

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O1

yajl_gen_status yajl_gen_double(yajl_gen g,double number)

{
  yajl_gen_state yVar1;
  yajl_print_t p_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  char i [32];
  char local_48 [32];
  
  yVar1 = g->state[g->depth];
  uVar6 = yVar1 - yajl_gen_map_start;
  if ((uVar6 < 7) && ((99U >> (uVar6 & 0x1f) & 1) != 0)) {
    return *(yajl_gen_status *)(&DAT_0010799c + (ulong)uVar6 * 4);
  }
  if (0x7fefffffffffffff < (ulong)ABS(number)) {
    return yajl_gen_invalid_number;
  }
  if (yVar1 == yajl_gen_map_val) {
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto LAB_00105610;
    pcVar7 = " ";
  }
  else {
    if ((yVar1 != yajl_gen_in_array) || ((*g->print)(g->ctx,",",1), (g->flags & 1) == 0))
    goto LAB_00105610;
    pcVar7 = "\n";
  }
  (*g->print)(g->ctx,pcVar7,1);
LAB_00105610:
  if ((((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val)) && (g->depth != 0)) {
    uVar6 = 0;
    do {
      p_Var2 = g->print;
      pvVar3 = g->ctx;
      pcVar7 = g->indentString;
      sVar4 = strlen(pcVar7);
      (*p_Var2)(pvVar3,pcVar7,sVar4 & 0xffffffff);
      uVar6 = uVar6 + 1;
    } while (uVar6 < g->depth);
  }
  sprintf(local_48,"%.20g",number);
  sVar4 = strspn(local_48,"0123456789-");
  sVar5 = strlen(local_48);
  if (sVar4 == sVar5) {
    sVar4 = strlen(local_48);
    (local_48 + sVar4)[0] = '.';
    (local_48 + sVar4)[1] = '0';
    local_48[sVar4 + 2] = '\0';
  }
  p_Var2 = g->print;
  pvVar3 = g->ctx;
  sVar4 = strlen(local_48);
  (*p_Var2)(pvVar3,local_48,sVar4 & 0xffffffff);
  uVar6 = g->depth;
  if ((ulong)g->state[uVar6] < 5) {
    g->state[uVar6] = *(yajl_gen_state *)(&DAT_001079b8 + (ulong)g->state[uVar6] * 4);
  }
  if (((g->flags & 1) != 0) && (g->state[uVar6] == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_double(yajl_gen g, double number)
{
    char i[32];
    ENSURE_VALID_STATE; ENSURE_NOT_KEY;
    if (isnan(number) || isinf(number)) return yajl_gen_invalid_number;
    INSERT_SEP; INSERT_WHITESPACE;
    sprintf(i, "%.20g", number);
    if (strspn(i, "0123456789-") == strlen(i)) {
        strcat(i, ".0");
    }
    g->print(g->ctx, i, (unsigned int)strlen(i));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}